

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O0

void anon_unknown.dwarf_c0738::CounterOnATemplate<int>(void)

{
  int iVar1;
  string_view local_18;
  
  if (::(anonymous_namespace)::CounterOnATemplate<int>()::counter == '\0') {
    iVar1 = __cxa_guard_acquire(&::(anonymous_namespace)::CounterOnATemplate<int>()::counter);
    if (iVar1 != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_18,"Foo.Bar");
      google::protobuf::internal::RealDebugCounter::RealDebugCounter
                (&CounterOnATemplate<int>::counter,local_18);
      __cxa_guard_release(&::(anonymous_namespace)::CounterOnATemplate<int>()::counter);
    }
  }
  google::protobuf::internal::RealDebugCounter::Inc(&CounterOnATemplate<int>::counter);
  return;
}

Assistant:

void CounterOnATemplate() {
  static google::protobuf::internal::RealDebugCounter counter("Foo.Bar");
  counter.Inc();
}